

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_val_vec_delete(wasm_val_vec_t *vec)

{
  ulong local_18;
  size_t i;
  wasm_val_vec_t *vec_local;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_val_vec_delete");
  for (local_18 = 0; local_18 < vec->size; local_18 = local_18 + 1) {
    wasm_val_delete(vec->data + local_18);
  }
  if (vec->data != (wasm_val_t *)0x0) {
    operator_delete__(vec->data);
  }
  vec->size = 0;
  return;
}

Assistant:

void wasm_val_vec_delete(own wasm_val_vec_t* vec) {
  TRACE0();
  for (size_t i = 0; i < vec->size; ++i) {
    wasm_val_delete(&vec->data[i]);
  }
  delete[] vec->data;
  vec->size = 0;
}